

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O0

void __thiscall DIS::DataStream::DoFlip(DataStream *this,char *buf,size_t bufsize)

{
  char cVar1;
  char *pcStack_30;
  char temp;
  char *end;
  char *start;
  size_t bufsize_local;
  char *buf_local;
  DataStream *this_local;
  
  if ((this->_machine_endian != this->_stream_endian) && (1 < bufsize)) {
    pcStack_30 = buf + (bufsize - 1);
    for (end = buf; end < pcStack_30; end = end + 1) {
      cVar1 = *end;
      *end = *pcStack_30;
      *pcStack_30 = cVar1;
      pcStack_30 = pcStack_30 + -1;
    }
  }
  return;
}

Assistant:

void DataStream::DoFlip(char* buf, size_t bufsize)
{
   if( _machine_endian == _stream_endian || bufsize<2 )
   {
      return;
   }

   // flip it, this fills back to front
   char* start = &buf[0];
   char* end = &buf[bufsize-1];
   while( start < end )
   {
      /// save the beginning of the buffer
      char temp = *start;

      /// overwrite the beginning of the buffer
      *start = *end;
      *end = temp;

      ++start;
      --end;
   }
}